

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
Graph<unsigned_long,_scc::VectorType>::scc
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Graph<unsigned_long,_scc::VectorType> *this)

{
  pointer *this_00;
  bool bVar1;
  reference ppNVar2;
  reference ppNVar3;
  reference this_01;
  reference src;
  Node *pNVar4;
  Node *i_1;
  iterator __end0_1;
  iterator __begin0_1;
  Container *__range2;
  Node *j;
  iterator __end0;
  iterator __begin0;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *__range4;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  subgraph;
  reverse_iterator i;
  undefined1 local_50 [8];
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  reversed_topological_order;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  local_30;
  Graph<unsigned_long,_scc::VectorType> *local_18;
  Graph<unsigned_long,_scc::VectorType> *this_local;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *result;
  
  local_18 = this;
  this_local = (Graph<unsigned_long,_scc::VectorType> *)__return_storage_ptr__;
  dual_dfs(&local_30,this);
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::~vector(&local_30);
  reversed_topological_order.
  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(__return_storage_ptr__);
  dual_dfs((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
            *)local_50,this);
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::rbegin((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
            *)&stack0xffffffffffffff98);
  while( true ) {
    this_00 = &subgraph.
               super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ::rend((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
            *)this_00);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                             *)&stack0xffffffffffffff98,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                             *)this_00);
    if (!bVar1) break;
    ppNVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                           *)&stack0xffffffffffffff98);
    if (((*ppNVar2)->visited & 1U) == 0) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::emplace_back<>(__return_storage_ptr__);
      __range4 = (vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                  *)0x0;
      subgraph.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      subgraph.
      super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ::vector((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                *)&__range4);
      ppNVar2 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                             *)&stack0xffffffffffffff98);
      Node::primal_dfs(*ppNVar2,(vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                                 *)&__range4);
      __end0 = std::
               vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
               ::begin((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                        *)&__range4);
      j = (Node *)std::
                  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                  ::end((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                         *)&__range4);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end0,(__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
                                    *)&j);
        if (!bVar1) break;
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
                  ::operator*(&__end0);
        pNVar4 = *ppNVar3;
        this_01 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::back(__return_storage_ptr__);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_01,&pNVar4->name)
        ;
        __gnu_cxx::
        __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
        ::operator++(&__end0);
      }
      std::
      vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
      ::~vector((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                 *)&__range4);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_**,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>_>
                  *)&stack0xffffffffffffff98);
  }
  __end0_1 = std::
             vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
             ::begin(&this->nodes);
  i_1 = (Node *)std::
                vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>
                ::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0_1,
                       (__normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
                        *)&i_1);
    if (!bVar1) break;
    src = __gnu_cxx::
          __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
          ::operator*(&__end0_1);
    pNVar4 = ::scc::VectorType<unsigned_long,Graph<unsigned_long,scc::VectorType>::Node>::
             get<Graph<unsigned_long,scc::VectorType>::Node>(src);
    pNVar4->visited = false;
    __gnu_cxx::
    __normal_iterator<Graph<unsigned_long,_scc::VectorType>::Node_*,_std::vector<Graph<unsigned_long,_scc::VectorType>::Node,_std::allocator<Graph<unsigned_long,_scc::VectorType>::Node>_>_>
    ::operator++(&__end0_1);
  }
  reversed_topological_order.
  super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  ::~vector((vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
             *)local_50);
  if ((reversed_topological_order.
       super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Index>> scc() {
        dual_dfs();
        std::vector<std::vector<Index>> result;
        auto reversed_topological_order = dual_dfs();
        for (auto i = reversed_topological_order.rbegin(); i != reversed_topological_order.rend(); ++i) {
            if (!(*i)->visited) {
                result.emplace_back();
                std::vector<const Node *> subgraph{};
                (*i)->primal_dfs(subgraph);
                for (auto j: subgraph) {
                    result.back().push_back(j->name);
                }
            }
        }
        for (auto &i: nodes) {
            TypeImpl::get(i).visited = false;
        }
        return result;
    }